

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

SpecifyBlockSyntax * __thiscall
slang::parsing::Parser::parseSpecifyBlock(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  SpecifyBlockSyntax *pSVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token specify;
  MemberSyntax *member;
  Token endspecify;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  MemberSyntax *local_108;
  pointer local_100;
  size_t local_f8;
  Info *local_f0;
  undefined8 local_e8;
  Token *local_e0;
  Token *local_d8;
  Token local_d0;
  Token local_c0;
  SyntaxNode *local_b0;
  SyntaxNode *pSStack_a8;
  pointer local_98;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_88;
  
  local_f8 = (size_t)attributes._M_extent._M_extent_value;
  local_100 = attributes._M_ptr;
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar9.info;
  local_e8 = TVar9._0_8_;
  Token::Token(&local_d0);
  local_88.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_88.super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_88.super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_d8 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_e0 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = false;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0x9d)) break;
    local_108 = parseSpecifyItem(this);
    bVar8 = local_108 == (MemberSyntax *)0x0;
    if (bVar8) {
      bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar2) {
        local_c0 = ParserBase::peek(&this->super_ParserBase);
        range = Token::range(&local_c0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_c0 = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText(&local_c0);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar7 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar4 = Token::location(local_d8);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
          SVar4 = Token::location(local_e0);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar6 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
      bVar6 = bVar8;
    }
    else {
      checkMemberAllowed(this,&local_108->super_SyntaxNode,SpecifyBlock);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_88,&local_108);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_108->super_SyntaxNode).previewNode = pSVar1;
      bVar6 = bVar8;
    }
  }
  local_d0 = ParserBase::expect(&this->super_ParserBase,EndSpecifyKeyword);
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_d0.info);
  local_98 = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SyntaxNode **)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      &local_88.super_SyntaxListBase.super_SyntaxNode.previewNode) {
    operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.childCount = local_f8;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_100;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_f8;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
  local_c0.info._0_4_ = 1;
  local_b0 = (SyntaxNode *)0x0;
  pSStack_a8 = (SyntaxNode *)0x0;
  local_c0._0_8_ = &PTR_getChild_00c94a68;
  specify.info = local_f0;
  specify.kind = (undefined2)local_e8;
  specify._2_1_ = local_e8._2_1_;
  specify.numFlags.raw = local_e8._3_1_;
  specify.rawLen = local_e8._4_4_;
  pSVar5 = slang::syntax::SyntaxFactory::specifyBlock
                     (&this->factory,&local_88,specify,
                      (SyntaxList<slang::syntax::MemberSyntax> *)&local_c0,local_d0);
  return pSVar5;
}

Assistant:

SpecifyBlockSyntax& Parser::parseSpecifyBlock(AttrList attributes) {
    auto specify = consume();

    Token endspecify;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndSpecifyKeyword, endspecify, SyntaxKind::SpecifyBlock,
        [this](SyntaxKind, bool&) { return parseSpecifyItem(); });

    return factory.specifyBlock(attributes, specify, members, endspecify);
}